

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtyperevision.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QTypeRevision *revision)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  QDebug *this;
  QTypeRevision *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  int in_stack_ffffffffffffff4c;
  QDebugStateSaver *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  quint8 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  QDebug *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QDebugStateSaver *in_stack_ffffffffffffff70;
  QDebug *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDebugStateSaver::QDebugStateSaver
            (in_stack_ffffffffffffff70,
             (QDebug *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  bVar2 = QTypeRevision::hasMajorVersion(in_RDX);
  if (bVar2) {
    uVar3 = QTypeRevision::hasMinorVersion(in_RDX);
    if ((bool)uVar3) {
      QDebug::nospace(in_RSI);
      QTypeRevision::majorVersion(in_RDX);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff50,
                         (char)((uint)in_stack_ffffffffffffff4c >> 0x18));
      QTypeRevision::minorVersion(in_RDX);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    else {
      this = QDebug::nospace(in_RSI);
      QDebug::noquote(this);
      QTypeRevision::majorVersion(in_RDX);
      in_stack_ffffffffffffff60 =
           QDebug::operator<<((QDebug *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      QDebug::operator<<(this,(char *)CONCAT17(uVar3,in_stack_ffffffffffffffa8));
    }
  }
  else {
    in_stack_ffffffffffffff5f = QTypeRevision::hasMinorVersion(in_RDX);
    if ((bool)in_stack_ffffffffffffff5f) {
      in_stack_ffffffffffffff5e = QTypeRevision::minorVersion(in_RDX);
      QDebug::operator<<((QDebug *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    else {
      in_stack_ffffffffffffff50 = (QDebugStateSaver *)QDebug::noquote(in_RSI);
      QDebug::operator<<(in_stack_ffffffffffffff78,
                         (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    }
  }
  QDebug::QDebug(in_stack_ffffffffffffff60,
                 (QDebug *)
                 CONCAT17(in_stack_ffffffffffffff5f,
                          CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff50);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug debug, const QTypeRevision &revision)
{
    QDebugStateSaver saver(debug);
    if (revision.hasMajorVersion()) {
        if (revision.hasMinorVersion())
            debug.nospace() << revision.majorVersion() << '.' << revision.minorVersion();
        else
            debug.nospace().noquote() << revision.majorVersion() << ".x";
    } else {
        if (revision.hasMinorVersion())
            debug << revision.minorVersion();
        else
            debug.noquote() << "invalid";
    }
    return debug;
}